

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O1

void __thiscall myvk::Device::~Device(Device *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Device_0032f3b0;
  if (this->m_pipeline_cache != (VkPipelineCache)0x0) {
    (*vkDestroyPipelineCache)(this->m_device,this->m_pipeline_cache,(VkAllocationCallbacks *)0x0);
  }
  if (this->m_allocator != (VmaAllocator)0x0) {
    vmaDestroyAllocator(this->m_allocator);
  }
  if (this->m_device != (VkDevice)0x0) {
    (*vkDestroyDevice)(this->m_device,(VkAllocationCallbacks *)0x0);
  }
  p_Var2 = (this->m_physical_device_ptr).
           super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
           super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Device::~Device() {
	if (m_pipeline_cache)
		vkDestroyPipelineCache(m_device, m_pipeline_cache, nullptr);
	if (m_allocator)
		vmaDestroyAllocator(m_allocator);
	if (m_device)
		vkDestroyDevice(m_device, nullptr);
}